

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowsReporters.cpp
# Opt level: O2

bool __thiscall
ApprovalTests::Windows::WindowsDiffReporter::report
          (WindowsDiffReporter *this,string *received,string *approved)

{
  bool bVar1;
  string sStack_58;
  string local_38;
  
  bVar1 = SystemUtils::isWindowsOs();
  if (bVar1) {
    ::std::__cxx11::string::string((string *)&local_38,(string *)received);
    ::std::__cxx11::string::string((string *)&sStack_58,(string *)approved);
    bVar1 = FirstWorkingReporter::report(&this->super_FirstWorkingReporter,&local_38,&sStack_58);
    ::std::__cxx11::string::~string((string *)&sStack_58);
    ::std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool WindowsDiffReporter::report(std::string received, std::string approved) const
        {
            if (!SystemUtils::isWindowsOs())
            {
                return false;
            }
            return FirstWorkingReporter::report(received, approved);
        }